

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O1

void __thiscall OctreeBuilder::create_pipeline(OctreeBuilder *this,shared_ptr<myvk::Device> *device)

{
  shared_ptr<myvk::PipelineLayout> *pipeline_layout;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  VkSpecializationInfo spec_info;
  VkSpecializationMapEntry spec_entries [2];
  shared_ptr<myvk::ShaderModule> octree_tag_node_shader_module;
  uint32_t kOctreeTagNodeCompSpv [856];
  undefined1 local_e08 [32];
  undefined1 local_de8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_dc0;
  undefined1 local_db8 [32];
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  local_d98 [143];
  
  local_de8._32_8_ =
       (this->m_descriptor_set_layout).
       super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_dc0 = (this->m_descriptor_set_layout).
              super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  if (local_dc0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_dc0->_M_use_count = local_dc0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_dc0->_M_use_count = local_dc0->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)(local_de8 + 0x20);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector(local_d98,__l,(allocator_type *)local_db8);
  local_de8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_de8._8_8_ = (element_type *)0x0;
  local_de8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::PipelineLayout::Create
            ((PipelineLayout *)local_e08,device,local_d98,
             (vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_de8);
  uVar3 = local_e08._8_8_;
  uVar2 = local_e08._0_8_;
  local_e08._0_8_ = (_func_int **)0x0;
  local_e08._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_pipeline_layout).
           super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar2;
  (this->m_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_e08._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e08._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_de8._0_8_,local_de8._16_8_ - local_de8._0_8_);
  }
  pipeline_layout = &this->m_pipeline_layout;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector(local_d98);
  if (local_dc0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_dc0);
  }
  local_db8._24_8_ =
       *(undefined8 *)
        &((this->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->m_voxel_resolution;
  local_e08._24_8_ = local_db8 + 0x18;
  local_de8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400000001;
  local_de8._24_8_ = (element_type *)0x4;
  local_de8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_de8._8_8_ = (element_type *)0x4;
  local_e08._0_4_ = 2;
  local_e08._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  local_e08._8_8_ = (element_type *)local_de8;
  memcpy(local_d98,&DAT_00233190,0xd60);
  myvk::ShaderModule::Create((ShaderModule *)(local_de8 + 0x20),device,(uint32_t *)local_d98,0xd60);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)local_db8,pipeline_layout,(Ptr<ShaderModule> *)(local_de8 + 0x20),
             (VkSpecializationInfo *)local_e08);
  uVar3 = local_db8._8_8_;
  uVar2 = local_db8._0_8_;
  local_db8._0_8_ = (_func_int **)0x0;
  local_db8._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_tag_node_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_tag_node_pipeline).super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar2;
  (this->m_tag_node_pipeline).super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_db8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_db8._8_8_);
  }
  if (local_dc0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_dc0);
  }
  memcpy(local_d98,&DAT_00233ef0,0x3f0);
  myvk::ShaderModule::Create((ShaderModule *)local_de8,device,(uint32_t *)local_d98,0x3f0);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)local_e08,pipeline_layout,(Ptr<ShaderModule> *)local_de8,
             (VkSpecializationInfo *)0x0);
  uVar3 = local_e08._8_8_;
  uVar2 = local_e08._0_8_;
  local_e08._0_8_ = (element_type *)0x0;
  local_e08._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_init_node_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_init_node_pipeline).super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar2;
  (this->m_init_node_pipeline).super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_e08._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e08._8_8_);
  }
  if ((element_type *)local_de8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de8._8_8_);
  }
  memcpy(local_d98,&DAT_002342e0,0x658);
  myvk::ShaderModule::Create((ShaderModule *)local_de8,device,(uint32_t *)local_d98,0x658);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)local_e08,pipeline_layout,(Ptr<ShaderModule> *)local_de8,
             (VkSpecializationInfo *)0x0);
  uVar3 = local_e08._8_8_;
  uVar2 = local_e08._0_8_;
  local_e08._0_8_ = (element_type *)0x0;
  local_e08._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_alloc_node_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_alloc_node_pipeline).
  super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_alloc_node_pipeline).
  super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_e08._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e08._8_8_);
  }
  if ((element_type *)local_de8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de8._8_8_);
  }
  memcpy(local_d98,&DAT_00234940,0x4cc);
  myvk::ShaderModule::Create((ShaderModule *)local_de8,device,(uint32_t *)local_d98,0x4cc);
  myvk::ComputePipeline::Create
            ((ComputePipeline *)local_e08,pipeline_layout,(Ptr<ShaderModule> *)local_de8,
             (VkSpecializationInfo *)0x0);
  uVar3 = local_e08._8_8_;
  uVar2 = local_e08._0_8_;
  local_e08._0_8_ = (_func_int **)0x0;
  local_e08._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_modify_arg_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_modify_arg_pipeline).
  super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_modify_arg_pipeline).
  super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_e08._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e08._8_8_);
  }
  if ((element_type *)local_de8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_de8._8_8_);
  }
  return;
}

Assistant:

void OctreeBuilder::create_pipeline(const std::shared_ptr<myvk::Device> &device) {
	m_pipeline_layout = myvk::PipelineLayout::Create(device, {m_descriptor_set_layout}, {});

	{
		uint32_t spec_data[] = {m_voxelizer_ptr->GetVoxelResolution(), m_voxelizer_ptr->GetVoxelFragmentCount()};
		VkSpecializationMapEntry spec_entries[] = {{0, 0, sizeof(uint32_t)}, {1, sizeof(uint32_t), sizeof(uint32_t)}};
		VkSpecializationInfo spec_info = {2, spec_entries, 2 * sizeof(uint32_t), spec_data};
		constexpr uint32_t kOctreeTagNodeCompSpv[] = {
#include "spirv/octree_tag_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_tag_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeTagNodeCompSpv, sizeof(kOctreeTagNodeCompSpv));
		m_tag_node_pipeline =
		    myvk::ComputePipeline::Create(m_pipeline_layout, octree_tag_node_shader_module, &spec_info);
	}

	{
		constexpr uint32_t kOctreeInitNodeCompSpv[] = {
#include "spirv/octree_init_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_init_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeInitNodeCompSpv, sizeof(kOctreeInitNodeCompSpv));
		m_init_node_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_init_node_shader_module);
	}

	{
		constexpr uint32_t kOctreeAllocNodeCompSpv[] = {
#include "spirv/octree_alloc_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_alloc_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeAllocNodeCompSpv, sizeof(kOctreeAllocNodeCompSpv));
		m_alloc_node_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_alloc_node_shader_module);
	}

	{
		constexpr uint32_t kOctreeModifyArgCompSpv[] = {
#include "spirv/octree_modify_arg.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_modify_arg_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeModifyArgCompSpv, sizeof(kOctreeModifyArgCompSpv));
		m_modify_arg_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_modify_arg_shader_module);
	}
}